

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O1

void __thiscall
DListBase<Memory::CustomHeap::Page,_RealCount>::MoveElementTo
          (DListBase<Memory::CustomHeap::Page,_RealCount> *this,Page *element,
          DListBase<Memory::CustomHeap::Page,_RealCount> *list)

{
  DListNodeBase<Memory::CustomHeap::Page> *pDVar1;
  code *pcVar2;
  bool bVar3;
  DListNode<Memory::CustomHeap::Page> *pDVar4;
  undefined4 *puVar5;
  char **ppcVar6;
  
  ppcVar6 = &element[-1].address;
  pDVar4 = (DListNode<Memory::CustomHeap::Page> *)this;
  do {
    pDVar4 = (pDVar4->super_DListNodeBase<Memory::CustomHeap::Page>).next.node;
    if (pDVar4 == (DListNode<Memory::CustomHeap::Page> *)this) break;
  } while (pDVar4 != (DListNode<Memory::CustomHeap::Page> *)ppcVar6);
  if (pDVar4 == (DListNode<Memory::CustomHeap::Page> *)this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x1a9,"(HasNode(node))","HasNode(node)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  **(undefined8 **)&element[-1].currentBucket = *ppcVar6;
  *(undefined8 *)(*ppcVar6 + 8) = *(undefined8 *)&element[-1].currentBucket;
  pDVar1 = (list->super_DListNodeBase<Memory::CustomHeap::Page>).next.base;
  *(anon_union_8_3_7fb8a913_for_prev *)&element[-1].currentBucket = pDVar1->prev;
  *ppcVar6 = (char *)pDVar1;
  *(char ***)pDVar1->prev = ppcVar6;
  (pDVar1->prev).base = (DListNodeBase<Memory::CustomHeap::Page> *)ppcVar6;
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  (list->super_RealCount).count = (list->super_RealCount).count + 1;
  return;
}

Assistant:

void MoveElementTo(TData * element, DListBase * list)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        DListBase::InsertNodeBefore(list->Next(), node);
        this->DecrementCount();
        list->IncrementCount();
    }